

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-value-types.cc
# Opt level: O2

void value_types_test(void)

{
  __type _Var1;
  bool bVar2;
  uint32_t uVar3;
  texcoord2f *ptVar4;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  uint uVar5;
  float fVar6;
  float fVar7;
  allocator local_91;
  storage_union local_90;
  undefined1 *local_80;
  token tok1;
  token tok3;
  token tok2;
  
  tinyusdz::Token::Token(&tok1,"bora");
  tinyusdz::Token::Token(&tok2,"muda");
  tinyusdz::Token::Token(&tok3,"bora");
  _Var1 = std::operator==(&tok1.str_,&tok1.str_);
  acutest_check_((uint)_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x13,"%s","tok1 == tok1");
  bVar2 = tinyusdz::operator!=(&tok1,&tok2);
  acutest_check_((uint)bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x14,"%s","tok1 != tok2");
  _Var1 = std::operator==(&tok1.str_,&tok3.str_);
  acutest_check_((uint)_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x15,"%s","tok1 == tok3");
  tinyusdz::value::GetTypeName_abi_cxx11_((string *)&local_90,(value *)0x6,tyid);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_90,"token");
  acutest_check_((uint)bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x17,"%s","value::GetTypeName(value::TYPE_ID_TOKEN) == \"token\"");
  std::__cxx11::string::~string((string *)&local_90);
  tinyusdz::value::GetTypeName_abi_cxx11_
            ((string *)&local_90,
             (value *)&std::
                       __pop_heap<__gnu_cxx::__normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>,___gnu_cxx::__ops::_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_syoyo[P]tinyusdz_src_value_types_hh:2288:15)>_>
                       .e_ident_version,tyid_00);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_90,"token[]");
  acutest_check_((uint)bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x18,"%s",
                 "value::GetTypeName(value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT) == \"token[]\""
                );
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"token",&local_91);
  uVar3 = tinyusdz::value::GetTypeId((string *)&local_90);
  acutest_check_((uint)(uVar3 == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1a,"%s","value::GetTypeId(\"token\") == value::TYPE_ID_TOKEN");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"token[]",&local_91);
  uVar3 = tinyusdz::value::GetTypeId((string *)&local_90);
  acutest_check_((uint)(uVar3 == 0x100006),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1b,"%s",
                 "value::GetTypeId(\"token[]\") == (value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT)"
                );
  std::__cxx11::string::~string((string *)&local_90);
  tinyusdz::value::TryGetTypeName_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_90,(value *)0xffffff,tyid_01);
  acutest_check_((byte)local_90._0_1_ ^ 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1d,"%s","!value::TryGetTypeName(value::TYPE_ID_ALL)");
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90);
  local_80 = linb::any::vtable_for_type<std::array<float,2ul>>()::table;
  local_90.dynamic = (void *)0x400000003f800000;
  ptVar4 = tinyusdz::value::Value::as<tinyusdz::value::texcoord2f>((Value *)&local_90,false);
  acutest_check_((uint)(ptVar4 != (texcoord2f *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x24,"%s","tex2f != nullptr");
  if (ptVar4 != (texcoord2f *)0x0) {
    fVar7 = ABS(ptVar4->s + -1.0);
    if (fVar7 <= 1.1920929e-07) {
      uVar5 = 1;
    }
    else {
      fVar6 = ABS(ptVar4->s);
      if (fVar6 <= 1.0) {
        fVar6 = 1.0;
      }
      uVar5 = (uint)(fVar7 <= fVar6 * 1.1920929e-07);
    }
    acutest_check_(uVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                   ,0x26,"%s","math::is_close(tex2f->s, 1.0f)");
    fVar7 = ABS(ptVar4->t + -2.0);
    if (fVar7 <= 1.1920929e-07) {
      uVar5 = 1;
    }
    else {
      fVar6 = ABS(ptVar4->t);
      if (fVar6 <= 2.0) {
        fVar6 = 2.0;
      }
      uVar5 = (uint)(fVar7 <= fVar6 * 1.1920929e-07);
    }
    acutest_check_(uVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                   ,0x27,"%s","math::is_close(tex2f->t, 2.0f)");
  }
  if (local_80 != (undefined1 *)0x0) {
    (**(code **)(local_80 + 0x20))(&local_90);
  }
  std::__cxx11::string::~string((string *)&tok3);
  std::__cxx11::string::~string((string *)&tok2);
  std::__cxx11::string::~string((string *)&tok1);
  return;
}

Assistant:

void value_types_test(void) {

  value::token tok1("bora");
  value::token tok2("muda");
  value::token tok3("bora");
  TEST_CHECK(tok1 == tok1);
  TEST_CHECK(tok1 != tok2);
  TEST_CHECK(tok1 == tok3);

  TEST_CHECK(value::GetTypeName(value::TYPE_ID_TOKEN) == "token");
  TEST_CHECK(value::GetTypeName(value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT) == "token[]");

  TEST_CHECK(value::GetTypeId("token") == value::TYPE_ID_TOKEN);
  TEST_CHECK(value::GetTypeId("token[]") == (value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT));

  TEST_CHECK(!value::TryGetTypeName(value::TYPE_ID_ALL));

  // texCoord2f <-> float2 cast
  value::float2 uv{1.0f, 2.0f};
  value::Value value(uv);

  value::texcoord2f *tex2f = value.as<value::texcoord2f>();
  TEST_CHECK(tex2f != nullptr);
  if (tex2f) {
    TEST_CHECK(math::is_close(tex2f->s, 1.0f));
    TEST_CHECK(math::is_close(tex2f->t, 2.0f));
  }

}